

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanContextTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::SpanContext_testFromStream_Test::~SpanContext_testFromStream_Test
          (SpanContext_testFromStream_Test *this)

{
  SpanContext_testFromStream_Test *this_local;
  
  ~SpanContext_testFromStream_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(SpanContext, testFromStream)
{
    const FromStreamTestCase testCases[] = {
        { "", false },
        { "abcd", false },
        { "ABCD", false },
        { "x:1:1:1", false },
        { "1:x:1:1", false },
        { "1:1:x:1", false },
        { "1:1:1:x", false },
        { "01234567890123456789012345678901234:1:1:1", false },
        { "01234567890123456789012345678901:1:1:1", true },
        { "01234_67890123456789012345678901:1:1:1", false },
        { "0123456789012345678901_345678901:1:1:1", false },
        { "1:0123456789012345:1:1", true },
        { "1:01234567890123456:1:1", false },
        { "10000000000000001:1:1:1", true },
        { "10000000000000001:1:1", false },
        { "1:1:1:1", true }
    };

    for (auto&& testCase : testCases) {
        SpanContext spanContext;
        {
            std::stringstream ss;
            ss << testCase._input;
            spanContext = SpanContext::fromStream(ss);
            ASSERT_EQ(testCase._success, spanContext.isValid())
                << "input=" << testCase._input;
        }

        SpanContext spanContextFromStreamOp;
        {
            std::stringstream ss;
            ss << testCase._input;
            ss >> spanContextFromStreamOp;
        }

        ASSERT_EQ(spanContext, spanContextFromStreamOp);
    }
}